

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotBarsHEx<ImPlot::GetterXsYs<unsigned_int>,double>
               (char *label_id,GetterXsYs<unsigned_int> *getter,double height)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint *puVar7;
  uint *puVar8;
  ImPlotPlot *pIVar9;
  double dVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  bool bVar13;
  ImU32 col;
  ImU32 col_00;
  ImDrawList *this;
  int iVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  ImPlotRange *pIVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  ImVec2 b;
  ImVec2 a;
  byte local_44;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar13 = BeginItem(label_id,1);
  pIVar12 = GImPlot;
  if (bVar13) {
    dVar23 = height * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar14 = getter->Count, 0 < iVar14)) {
      puVar7 = getter->Xs;
      puVar8 = getter->Ys;
      iVar17 = getter->Offset;
      iVar2 = getter->Stride;
      pIVar9 = GImPlot->CurrentPlot;
      iVar3 = pIVar9->CurrentYAxis;
      uVar4 = (pIVar9->XAxis).Flags;
      pIVar18 = GImPlot->ExtentsY + iVar3;
      uVar5 = pIVar9->YAxis[iVar3].Flags;
      iVar16 = 0;
      do {
        lVar15 = (long)(((iVar17 + iVar16) % iVar14 + iVar14) % iVar14) * (long)iVar2;
        uVar6 = *(uint *)((long)puVar7 + lVar15);
        dVar10 = (double)*(uint *)((long)puVar8 + lVar15);
        dVar11 = dVar10 - dVar23;
        if ((uVar4 >> 10 & 1) == 0) {
          if ((uVar4 & 0x20) == 0) {
LAB_001fcbf6:
            dVar21 = (pIVar12->ExtentsX).Min;
            dVar22 = 0.0;
            if (dVar21 <= 0.0) {
              dVar22 = dVar21;
            }
            (pIVar12->ExtentsX).Min = dVar22;
            dVar21 = (pIVar12->ExtentsX).Max;
            dVar22 = 0.0;
            if (0.0 <= dVar21) {
              dVar22 = dVar21;
            }
            (pIVar12->ExtentsX).Max = dVar22;
          }
        }
        else if ((((uVar4 & 0x20) == 0) && (pIVar9->YAxis[iVar3].Range.Min <= dVar11)) &&
                (dVar11 <= pIVar9->YAxis[iVar3].Range.Max)) goto LAB_001fcbf6;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar11) < 0x7ff0000000000000) {
LAB_001fcc54:
            if ((0.0 < dVar11) || ((uVar5 & 0x20) == 0)) {
              dVar21 = dVar11;
              if (pIVar18->Min <= dVar11) {
                dVar21 = pIVar18->Min;
              }
              pIVar18->Min = dVar21;
              dVar21 = pIVar12->ExtentsY[iVar3].Max;
              if (dVar11 <= dVar21) {
                dVar11 = dVar21;
              }
              pIVar12->ExtentsY[iVar3].Max = dVar11;
            }
          }
        }
        else if ((((long)ABS(dVar11) < 0x7ff0000000000000) && ((pIVar9->XAxis).Range.Min <= 0.0)) &&
                (0.0 <= (pIVar9->XAxis).Range.Max)) goto LAB_001fcc54;
        dVar11 = (double)uVar6;
        dVar10 = dVar10 + dVar23;
        if ((uVar4 >> 10 & 1) == 0) {
          if ((uVar6 != 0) || ((uVar4 & 0x20) == 0)) {
LAB_001fccba:
            dVar21 = (pIVar12->ExtentsX).Min;
            dVar22 = dVar11;
            if (dVar21 <= dVar11) {
              dVar22 = dVar21;
            }
            (pIVar12->ExtentsX).Min = dVar22;
            dVar21 = (pIVar12->ExtentsX).Max;
            dVar22 = dVar11;
            if (dVar11 <= dVar21) {
              dVar22 = dVar21;
            }
            (pIVar12->ExtentsX).Max = dVar22;
          }
        }
        else if (((pIVar9->YAxis[iVar3].Range.Min <= dVar10) &&
                 (dVar10 <= pIVar9->YAxis[iVar3].Range.Max)) &&
                (local_44 = (byte)((uVar4 & 0x20) >> 5), (uVar6 == 0 & local_44) == 0))
        goto LAB_001fccba;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar10) < 0x7ff0000000000000) {
LAB_001fcd18:
            if ((0.0 < dVar10) || ((uVar5 & 0x20) == 0)) {
              uVar19 = SUB84(dVar10,0);
              uVar20 = (undefined4)((ulong)dVar10 >> 0x20);
              dVar11 = pIVar18->Min;
              if (dVar11 <= dVar10) {
                uVar19 = SUB84(dVar11,0);
                uVar20 = (undefined4)((ulong)dVar11 >> 0x20);
              }
              pIVar18->Min = (double)CONCAT44(uVar20,uVar19);
              dVar11 = pIVar12->ExtentsY[iVar3].Max;
              if (dVar10 <= dVar11) {
                dVar10 = dVar11;
              }
              pIVar12->ExtentsY[iVar3].Max = dVar10;
            }
          }
        }
        else if ((((long)ABS(dVar10) < 0x7ff0000000000000) && ((pIVar9->XAxis).Range.Min <= dVar11))
                && (dVar11 <= (pIVar9->XAxis).Range.Max)) goto LAB_001fcd18;
        iVar16 = iVar16 + 1;
      } while (iVar14 != iVar16);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar12->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar12->NextItemData).Colors + 1);
    iVar14 = getter->Count;
    if (0 < iVar14) {
      bVar13 = (pIVar12->NextItemData).RenderFill;
      bVar1 = (pIVar12->NextItemData).RenderLine;
      iVar17 = 0;
      do {
        lVar15 = (long)(((getter->Offset + iVar17) % iVar14 + iVar14) % iVar14) *
                 (long)getter->Stride;
        uVar4 = *(uint *)((long)getter->Xs + lVar15);
        if (uVar4 != 0) {
          dVar10 = (double)*(uint *)((long)getter->Ys + lVar15);
          local_38 = PlotToPixels(0.0,dVar10 - dVar23,-1);
          local_40 = PlotToPixels((double)uVar4,dVar10 + dVar23,-1);
          if ((pIVar12->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar13 ^ 1U | col != col_00) & bVar1) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar12->NextItemData).LineWeight);
          }
        }
        iVar17 = iVar17 + 1;
        iVar14 = getter->Count;
      } while (iVar17 < iVar14);
    }
    pIVar12 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar12->NextItemData);
    pIVar12->PreviousItem = pIVar12->CurrentItem;
    pIVar12->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsHEx(const char* label_id, const Getter& getter, THeight height) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const THeight half_height = height / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(0, p.y - half_height));
                FitPoint(ImPlotPoint(p.x, p.y + half_height));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.x == 0)
                continue;
            ImVec2 a = PlotToPixels(0, p.y - half_height);
            ImVec2 b = PlotToPixels(p.x, p.y + half_height);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}